

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# play.c
# Opt level: O1

void xm_tone_portamento(xm_context_t *ctx,xm_channel_context_t *ch)

{
  xm_frequency_type_t xVar1;
  byte bVar2;
  byte bVar3;
  long lVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  
  fVar10 = ch->tone_portamento_target_period;
  if ((fVar10 != 0.0) || (NAN(fVar10))) {
    fVar9 = ch->period;
    if ((fVar9 != fVar10) || (NAN(fVar9) || NAN(fVar10))) {
      if (fVar9 <= fVar10) {
        if ((fVar10 <= fVar9) ||
           (fVar9 = (float)ch->tone_portamento_param *
                    *(float *)(&DAT_001076f4 +
                              (ulong)((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) * 4) +
                    fVar9, ch->period = fVar9, fVar9 <= fVar10)) {
          fVar10 = ch->period;
          fVar11 = (float)ch->arp_note_offset;
          fVar9 = ch->vibrato_note_offset + ch->autovibrato_note_offset;
          xVar1 = (ctx->module).frequency_type;
          if (xVar1 == XM_AMIGA_FREQUENCIES) {
            if (ch->arp_note_offset == 0) {
              fVar10 = fVar9 * 16.0 + fVar10;
            }
            else {
              fVar10 = fVar10 * 1024.0;
              if (fVar10 <= 1753088.0) {
                bVar2 = 0;
                fVar7 = 876544.0;
                while (fVar10 < fVar7) {
                  bVar2 = bVar2 + 1;
                  fVar7 = (float)(int)(0xd6000 >> (bVar2 & 0x1f));
                }
              }
              else {
                bVar2 = 0;
                do {
                  bVar3 = 1 - bVar2;
                  bVar2 = bVar2 - 1;
                } while ((float)(uint)(0x1ac000 << (bVar3 & 0x1f)) < fVar10);
              }
              lVar4 = 0;
              do {
                uVar6 = amiga_frequencies[lVar4];
                uVar5 = amiga_frequencies[lVar4 + 1];
                if ((char)bVar2 < '\x01') {
                  if ((char)bVar2 < '\0') {
                    uVar6 = uVar6 << (-bVar2 & 0x1f);
                    uVar5 = uVar5 << (-bVar2 & 0x1f);
                  }
                }
                else {
                  uVar6 = (int)uVar6 >> (bVar2 & 0x1f);
                  uVar5 = (int)uVar5 >> (bVar2 & 0x1f);
                }
                fVar7 = (float)(int)uVar6;
                if (((float)(int)uVar5 <= fVar10) && (fVar10 <= fVar7)) {
                  fVar8 = (float)(int)(char)lVar4;
                  goto LAB_00105307;
                }
                lVar4 = lVar4 + 1;
              } while (lVar4 != 0xc);
              fVar8 = 0.0;
LAB_00105307:
              if ((fVar7 < fVar10) || (fVar10 < (float)(int)uVar5)) {
                fprintf(_stderr,"%s(): %d <= %f <= %d should hold but doesn\'t, this is a bug\n",
                        (double)fVar10,"xm_frequency",(ulong)uVar5,(ulong)uVar6);
                fflush(_stderr);
              }
              fVar10 = xm_amiga_period((fVar10 - fVar7) / (float)(int)(uVar5 - uVar6) +
                                       (float)((char)bVar2 + 2) * 12.0 + fVar8 + fVar11);
              fVar10 = fVar9 * 16.0 + fVar10;
            }
            fVar7 = (float)(~-(uint)(fVar10 == 0.0) & (uint)(7093789.0 / (fVar10 + fVar10)));
          }
          else {
            fVar7 = 0.0;
            if (xVar1 == XM_LINEAR_FREQUENCIES) {
              fVar7 = exp2f((4608.0 - (fVar9 * -16.0 + fVar11 * -64.0 + fVar10)) / 768.0);
              fVar7 = fVar7 * 8363.0;
            }
          }
          ch->frequency = fVar7;
          ch->step = fVar7 / (float)ctx->rate;
          return;
        }
      }
      else {
        fVar9 = (float)ch->tone_portamento_param *
                *(float *)(&DAT_001076fc +
                          (ulong)((ctx->module).frequency_type == XM_LINEAR_FREQUENCIES) * 4) +
                fVar9;
        ch->period = fVar9;
        if (fVar10 <= fVar9) {
          xm_update_frequency(ctx,ch);
          return;
        }
      }
      ch->period = fVar10;
      xm_update_frequency(ctx,ch);
      return;
    }
  }
  return;
}

Assistant:

static void xm_tone_portamento(xm_context_t* ctx, xm_channel_context_t* ch) {
	/* 3xx called without a note, wait until we get an actual
	 * target note. */
	if(ch->tone_portamento_target_period == 0.f) return;

	if(ch->period != ch->tone_portamento_target_period) {
		XM_SLIDE_TOWARDS(ch->period,
		                 ch->tone_portamento_target_period,
		                 (ctx->module.frequency_type == XM_LINEAR_FREQUENCIES ?
		                  4.f : 1.f) * ch->tone_portamento_param
		);
		xm_update_frequency(ctx, ch);
	}
}